

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.c
# Opt level: O0

void OnUpdate(GLContext *info)

{
  nk_rect bounds;
  _Bool _Var1;
  uint8_t uVar2;
  nk_bool nVar3;
  long in_RDI;
  int height;
  int width;
  GLContext *context;
  MousePos pos;
  _Bool isLeftButtonPressed;
  nk_colorf bg;
  nk_glfw *in_stack_000000e0;
  int in_stack_00000134;
  int in_stack_00000138;
  nk_anti_aliasing in_stack_0000013c;
  nk_glfw *in_stack_00000140;
  int in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  nk_flags alignment;
  double *in_stack_ffffffffffffffa8;
  int *width_00;
  GLsizei in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  MousePos in_stack_ffffffffffffffb8;
  Gamefield *in_stack_ffffffffffffffd0;
  
  (*glad_glClear)(0x4100);
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  BindShader((uint32_t *)0x15a237);
  _Var1 = IsMousePressed(0);
  if (_Var1) {
    glfwGetCursorPos((GLFWwindow *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8,
                     (double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    glfwGetWindowUserPointer
              ((GLFWwindow *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    OnGamefieldClick((Gamefield *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffb8);
  }
  alignment = 0;
  BindGamefield(0,(Gamefield *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  OnUpdateGamefield(in_stack_ffffffffffffffd0);
  BindVertexArray((uint32_t *)0x15a2c0);
  (*glad_glDrawElements)(4,0x18,0x1405,(void *)alignment);
  UnBindGamefield((Gamefield *)0x15a2ed);
  nk_glfw3_new_frame(in_stack_000000e0);
  width_00 = *(int **)(in_RDI + 0x20);
  nk_rect(0.0,0.0,250.0,250.0);
  bounds.w = (float)in_stack_ffffffffffffffb0;
  bounds._0_8_ = width_00;
  bounds.h = in_stack_ffffffffffffffb4;
  nVar3 = nk_begin((nk_context *)CONCAT44(alignment,in_stack_ffffffffffffffa0),
                   (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),bounds,0);
  if (nVar3 != 0) {
    nk_layout_row_static
              ((nk_context *)CONCAT44(alignment,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
               ,in_stack_ffffffffffffff98,0);
    nk_label((nk_context *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (char *)width_00,alignment);
    nk_layout_row_dynamic
              ((nk_context *)CONCAT44(alignment,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
               ,in_stack_ffffffffffffff98);
    nVar3 = nk_option_label((nk_context *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (char *)width_00,alignment);
    if (nVar3 != 0) {
      OnUpdate::pixelType = 0;
    }
    nVar3 = nk_option_label((nk_context *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (char *)width_00,alignment);
    if (nVar3 != 0) {
      OnUpdate::pixelType = 1;
    }
    nVar3 = nk_option_label((nk_context *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (char *)width_00,alignment);
    if (nVar3 != 0) {
      OnUpdate::pixelType = 6;
    }
    nVar3 = nk_option_label((nk_context *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (char *)width_00,alignment);
    if (nVar3 != 0) {
      OnUpdate::pixelType = 5;
    }
    nVar3 = nk_option_label((nk_context *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (char *)width_00,alignment);
    if (nVar3 != 0) {
      OnUpdate::pixelType = 4;
    }
    nVar3 = nk_option_label((nk_context *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (char *)width_00,alignment);
    if (nVar3 != 0) {
      OnUpdate::pixelType = 3;
    }
    SetCurrentPixelType(OnUpdate::pixelType);
    nk_layout_row_static
              ((nk_context *)CONCAT44(alignment,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
               ,in_stack_ffffffffffffff98,0);
    nVar3 = nk_button_label((nk_context *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (char *)width_00);
    if (nVar3 != 0) {
      ClearGamefield(*(Gamefield **)(in_RDI + 0x18));
    }
    nk_layout_row_static
              ((nk_context *)CONCAT44(alignment,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
               ,in_stack_ffffffffffffff98,0);
    nk_label((nk_context *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (char *)width_00,alignment);
    nk_layout_row_static
              ((nk_context *)CONCAT44(alignment,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c
               ,in_stack_ffffffffffffff98,0);
    nVar3 = nk_button_label((nk_context *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (char *)width_00);
    if ((nVar3 != 0) && (uVar2 = GetCurrentPixelsRadius(), uVar2 != '\0')) {
      uVar2 = GetCurrentPixelsRadius();
      SetPixelsRadius(uVar2 + 0xff);
    }
    nVar3 = nk_button_label((nk_context *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            (char *)width_00);
    if ((nVar3 != 0) && (uVar2 = GetCurrentPixelsRadius(), uVar2 != 0xff)) {
      uVar2 = GetCurrentPixelsRadius();
      SetPixelsRadius(uVar2 + '\x01');
    }
  }
  nk_end((nk_context *)CONCAT44(alignment,in_stack_ffffffffffffffa0));
  glfwGetWindowSize((GLFWwindow *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    width_00,(int *)CONCAT44(alignment,in_stack_ffffffffffffffa0));
  (*glad_glViewport)(0,0,(GLsizei)in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  nVar3 = nk_item_is_any_active((nk_context *)CONCAT44(alignment,in_stack_ffffffffffffffa0));
  SetUiUse(nVar3 != 0);
  glfwPollEvents();
  nk_glfw3_render(in_stack_00000140,in_stack_0000013c,in_stack_00000138,in_stack_00000134);
  glfwSwapBuffers((GLFWwindow *)CONCAT44(alignment,in_stack_ffffffffffffffa0));
  return;
}

Assistant:

void OnUpdate(struct GLContext const* info) {
    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
    glClearColor(0, 0, 0, 1);
    struct nk_colorf bg;
    bg.r = 0.10f, bg.g = 0.18f, bg.b = 0.24f, bg.a = 1.0f;

    BindShader(&info->basicShaderId);
    bool isLeftButtonPressed = IsMousePressed(GLFW_MOUSE_BUTTON_1);
    if (isLeftButtonPressed) {
        MousePos pos;
        struct GLContext* context;
        glfwGetCursorPos(info->window, &pos.x, &pos.y);
        context = glfwGetWindowUserPointer(info->window);
        OnGamefieldClick(context->gamefield, pos);
    }
    BindGamefield(0, info->gamefield);
    OnUpdateGamefield(info->gamefield);
    BindVertexArray(&info->vertexArrayId);

    glDrawElements(GL_TRIANGLES, 24, GL_UNSIGNED_INT, NULL);
    UnBindGamefield(info->gamefield);

    nk_glfw3_new_frame(info->glfw);
    static int pixelType;
    if (nk_begin(info->guiContext, "Controls", nk_rect(0, 0, 250, 250),
                 NK_WINDOW_BORDER | NK_WINDOW_TITLE)) {

        nk_layout_row_static(info->guiContext, 20, 100, 1);
        nk_label(info->guiContext, "Pixel types:", NK_TEXT_ALIGN_LEFT);

        nk_layout_row_dynamic(info->guiContext, 30, 2);
        if (nk_option_label(info->guiContext, "Sand", pixelType == Sand)) pixelType = Sand;
        if (nk_option_label(info->guiContext, "Water", pixelType == Water)) pixelType = Water;
        if (nk_option_label(info->guiContext, "Fire", pixelType == Fire)) pixelType = Fire;
        if (nk_option_label(info->guiContext, "Smoke", pixelType == Smoke)) pixelType = Smoke;
        if (nk_option_label(info->guiContext, "Plant", pixelType == Plant)) pixelType = Plant;
        if (nk_option_label(info->guiContext, "Stone", pixelType == Stone)) pixelType = Stone;
        SetCurrentPixelType(pixelType);

        nk_layout_row_static(info->guiContext, 20, 50, 3);
        if (nk_button_label(info->guiContext, "Clear")) {
            ClearGamefield(info->gamefield);
        }

        nk_layout_row_static(info->guiContext, 20, 100, 1);
        nk_label(info->guiContext, "Brush size:", NK_TEXT_ALIGN_LEFT);

        nk_layout_row_static(info->guiContext, 20, 50, 2);
        if (nk_button_label(info->guiContext, "-")) {
            if (GetCurrentPixelsRadius() > 0) {
                SetPixelsRadius(GetCurrentPixelsRadius() - 1);
            }
        }
        if (nk_button_label(info->guiContext, "+")) {
            if (GetCurrentPixelsRadius() < UINT8_MAX) {
                SetPixelsRadius(GetCurrentPixelsRadius() + 1);
            }
        }
    }

    nk_end(info->guiContext);

    int width, height;
    glfwGetWindowSize(info->window, &width, &height);
    glViewport(0, 0, width, height);
    SetUiUse(nk_item_is_any_active(info->guiContext));
    glfwPollEvents();
    nk_glfw3_render(info->glfw, NK_ANTI_ALIASING_ON, MAX_VERTEX_BUFFER, MAX_ELEMENT_BUFFER);
    glfwSwapBuffers(info->window);
}